

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O3

Vec_Int_t * Abc_NtkWriteMiniMapping(Abc_Ntk_t *pNtk)

{
  size_t __size;
  char cVar1;
  int iVar2;
  long *plVar3;
  uint uVar4;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *p;
  int *piVar5;
  uint *__ptr_00;
  void *pvVar6;
  char *__s;
  size_t sVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  
  if (pNtk->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x33c,"Vec_Int_t *Abc_NtkWriteMiniMapping(Abc_Ntk_t *)");
  }
  lVar13 = 0;
  __ptr = Abc_NtkDfs(pNtk,0);
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      *(int *)((long)pVVar8->pArray[lVar13] + 0x40) = (int)lVar13;
      lVar13 = lVar13 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar13 < pVVar8->nSize);
  }
  if (__ptr->nSize < 1) {
    iVar11 = 4;
  }
  else {
    lVar10 = 0;
    iVar11 = 0;
    do {
      pvVar6 = __ptr->pArray[lVar10];
      *(int *)((long)pvVar6 + 0x40) = (int)lVar13 + (int)lVar10;
      iVar11 = iVar11 + *(int *)((long)pvVar6 + 0x1c);
      lVar10 = lVar10 + 1;
    } while (lVar10 < __ptr->nSize);
    iVar11 = iVar11 + 4;
  }
  iVar2 = pNtk->vCos->nSize;
  iVar11 = iVar11 + pNtk->nObjCounts[7];
  p = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar2 + iVar11 + 9999U) {
    iVar9 = iVar2 + iVar11 + 10000;
  }
  p->nSize = 0;
  p->nCap = iVar9;
  if (iVar9 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar9 << 2);
  }
  p->pArray = piVar5;
  Vec_IntPush(p,pNtk->vCis->nSize);
  Vec_IntPush(p,pNtk->vCos->nSize);
  Vec_IntPush(p,pNtk->nObjCounts[7]);
  Vec_IntPush(p,pNtk->nObjCounts[8]);
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 10000;
  __ptr_00[1] = 0;
  pvVar6 = malloc(10000);
  *(void **)(__ptr_00 + 2) = pvVar6;
  if (0 < __ptr->nSize) {
    lVar13 = 0;
    do {
      plVar3 = (long *)__ptr->pArray[lVar13];
      Vec_IntPush(p,*(int *)((long)plVar3 + 0x1c));
      if (0 < *(int *)((long)plVar3 + 0x1c)) {
        lVar10 = 0;
        do {
          Vec_IntPush(p,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                          (long)*(int *)(plVar3[4] + lVar10 * 4) * 8) + 0x40));
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)plVar3 + 0x1c));
      }
      __s = Mio_GateReadName((Mio_Gate_t *)plVar3[7]);
      sVar7 = strlen(__s);
      if (0 < (int)(uint)sVar7) {
        uVar14 = 0;
        do {
          cVar1 = __s[uVar14];
          uVar12 = __ptr_00[1];
          if (uVar12 == *__ptr_00) {
            if ((int)uVar12 < 0x10) {
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar6 = malloc(0x10);
              }
              else {
                pvVar6 = realloc(*(void **)(__ptr_00 + 2),0x10);
              }
              *(void **)(__ptr_00 + 2) = pvVar6;
              *__ptr_00 = 0x10;
            }
            else {
              __size = (ulong)uVar12 * 2;
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar6 = malloc(__size);
              }
              else {
                pvVar6 = realloc(*(void **)(__ptr_00 + 2),__size);
              }
              *(void **)(__ptr_00 + 2) = pvVar6;
              *__ptr_00 = (uint)__size;
            }
          }
          else {
            pvVar6 = *(void **)(__ptr_00 + 2);
          }
          __ptr_00[1] = uVar12 + 1;
          *(char *)((long)pvVar6 + (long)(int)uVar12) = cVar1;
          uVar14 = uVar14 + 1;
        } while (((uint)sVar7 & 0x7fffffff) != uVar14);
      }
      uVar12 = __ptr_00[1];
      if (uVar12 == *__ptr_00) {
        if ((int)uVar12 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar6 = malloc(0x10);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr_00 + 2),0x10);
          }
          *(void **)(__ptr_00 + 2) = pvVar6;
          *__ptr_00 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar12 * 2;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar6 = malloc(sVar7);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr_00 + 2),sVar7);
          }
          *(void **)(__ptr_00 + 2) = pvVar6;
          *__ptr_00 = (uint)sVar7;
        }
      }
      else {
        pvVar6 = *(void **)(__ptr_00 + 2);
      }
      __ptr_00[1] = uVar12 + 1;
      *(undefined1 *)((long)pvVar6 + (long)(int)uVar12) = 0;
      lVar13 = lVar13 + 1;
    } while (lVar13 < __ptr->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      Vec_IntPush(p,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar8->pArray[lVar13] + 0x20) + 8) +
                                      (long)**(int **)((long)pVVar8->pArray[lVar13] + 0x20) * 8) +
                            0x40));
      lVar13 = lVar13 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar13 < pVVar8->nSize);
  }
  uVar12 = __ptr_00[1];
  iVar11 = (int)uVar12 % 4 + -4;
  do {
    if (uVar12 == *__ptr_00) {
      if ((int)uVar12 < 0x10) {
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar6 = malloc(0x10);
        }
        else {
          pvVar6 = realloc(*(void **)(__ptr_00 + 2),0x10);
        }
        *(void **)(__ptr_00 + 2) = pvVar6;
        *__ptr_00 = 0x10;
      }
      else {
        uVar4 = uVar12 * 2;
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar6 = malloc((ulong)uVar4);
        }
        else {
          pvVar6 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar4);
        }
        *(void **)(__ptr_00 + 2) = pvVar6;
        *__ptr_00 = uVar4;
      }
    }
    else {
      pvVar6 = *(void **)(__ptr_00 + 2);
    }
    __ptr_00[1] = uVar12 + 1;
    *(undefined1 *)((long)pvVar6 + (long)(int)uVar12) = 0;
    uVar12 = __ptr_00[1];
    iVar11 = iVar11 + 1;
  } while (iVar11 != 0);
  if ((uVar12 & 3) == 0) {
    pvVar6 = *(void **)(__ptr_00 + 2);
    if (0 < (int)uVar12 >> 2) {
      uVar14 = 0;
      do {
        Vec_IntPush(p,*(int *)((long)pvVar6 + uVar14 * 4));
        uVar14 = uVar14 + 1;
      } while ((uint)((int)uVar12 >> 2) != uVar14);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (pvVar6 != (void *)0x0) {
      free(pvVar6);
    }
    free(__ptr_00);
    return p;
  }
  __assert_fail("Vec_StrSize(vGates) % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                ,0x35f,"Vec_Int_t *Abc_NtkWriteMiniMapping(Abc_Ntk_t *)");
}

Assistant:

Vec_Int_t * Abc_NtkWriteMiniMapping( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vMapping;
    Vec_Str_t * vGates;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nNodes, nFanins, nExtra, * pArray;
    assert( Abc_NtkHasMapping(pNtk) );
    // collect nodes in the DFS order
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // assign unique numbers
    nNodes = nFanins = 0;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->iTemp = nNodes++, nFanins += Abc_ObjFaninNum(pObj);
    // allocate attay to store mapping (4 counters + fanins for each node + PO drivers + gate names)
    vMapping = Vec_IntAlloc( 4 + Abc_NtkNodeNum(pNtk) + nFanins + Abc_NtkCoNum(pNtk) + 10000 );
    // write the numbers of CI/CO/Node/FF
    Vec_IntPush( vMapping, Abc_NtkCiNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkCoNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkNodeNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkLatchNum(pNtk) );
    // write the nodes
    vGates = Vec_StrAlloc( 10000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntPush( vMapping, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vMapping, pFanin->iTemp );
        // remember this gate (to be added to the mapping later)
        Vec_StrPrintStr( vGates, Mio_GateReadName((Mio_Gate_t *)pObj->pData) );
        Vec_StrPush( vGates, '\0' );
    }
    // write the COs literals
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_IntPush( vMapping, Abc_ObjFanin0(pObj)->iTemp );
    // finish off the array
    nExtra = 4 - Vec_StrSize(vGates) % 4;
    for ( i = 0; i < nExtra; i++ )
        Vec_StrPush( vGates, '\0' );
    // add gates to the array
    assert( Vec_StrSize(vGates) % 4 == 0 );
    nExtra = Vec_StrSize(vGates) / 4;
    pArray = (int *)Vec_StrArray(vGates);
    for ( i = 0; i < nExtra; i++ )
        Vec_IntPush( vMapping, pArray[i] );
    // cleanup and return
    Vec_PtrFree( vNodes );
    Vec_StrFree( vGates );
    return vMapping;
}